

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O0

void __thiscall Eigen::IOFormat::IOFormat(IOFormat *this,IOFormat *param_1)

{
  undefined3 uVar1;
  int iVar2;
  IOFormat *param_1_local;
  IOFormat *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  std::__cxx11::string::string((string *)&this->matSuffix,(string *)&param_1->matSuffix);
  std::__cxx11::string::string((string *)&this->rowPrefix,(string *)&param_1->rowPrefix);
  std::__cxx11::string::string((string *)&this->rowSuffix,(string *)&param_1->rowSuffix);
  std::__cxx11::string::string((string *)&this->rowSeparator,(string *)&param_1->rowSeparator);
  std::__cxx11::string::string((string *)&this->rowSpacer,(string *)&param_1->rowSpacer);
  std::__cxx11::string::string((string *)&this->coeffSeparator,(string *)&param_1->coeffSeparator);
  uVar1 = *(undefined3 *)&param_1->field_0xe1;
  iVar2 = param_1->precision;
  this->fill = param_1->fill;
  *(undefined3 *)&this->field_0xe1 = uVar1;
  this->precision = iVar2;
  this->flags = param_1->flags;
  return;
}

Assistant:

IOFormat(int _precision = StreamPrecision, int _flags = 0,
    const std::string& _coeffSeparator = " ",
    const std::string& _rowSeparator = "\n", const std::string& _rowPrefix="", const std::string& _rowSuffix="",
    const std::string& _matPrefix="", const std::string& _matSuffix="", const char _fill=' ')
  : matPrefix(_matPrefix), matSuffix(_matSuffix), rowPrefix(_rowPrefix), rowSuffix(_rowSuffix), rowSeparator(_rowSeparator),
    rowSpacer(""), coeffSeparator(_coeffSeparator), fill(_fill), precision(_precision), flags(_flags)
  {
    // TODO check if rowPrefix, rowSuffix or rowSeparator contains a newline
    // don't add rowSpacer if columns are not to be aligned
    if((flags & DontAlignCols))
      return;
    int i = int(matSuffix.length())-1;
    while (i>=0 && matSuffix[i]!='\n')
    {
      rowSpacer += ' ';
      i--;
    }
  }